

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ForeverLoopStatement::evalImpl(ForeverLoopStatement *this,EvalContext *context)

{
  EvalContext *in_RDI;
  ER result;
  undefined4 in_stack_ffffffffffffffe0;
  ER in_stack_ffffffffffffffe4;
  
  while( true ) {
    do {
      in_stack_ffffffffffffffe4 =
           Statement::eval((Statement *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
    } while (in_stack_ffffffffffffffe4 == Success);
    if (in_stack_ffffffffffffffe4 == Break) break;
    if (in_stack_ffffffffffffffe4 != Continue) {
      return in_stack_ffffffffffffffe4;
    }
  }
  return Success;
}

Assistant:

ER ForeverLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}